

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

baseHolder * __thiscall
cs_impl::any::holder<std::pair<cs_impl::any,_cs_impl::any>_>::duplicate
          (holder<std::pair<cs_impl::any,_cs_impl::any>_> *this)

{
  holder<std::pair<cs_impl::any,_cs_impl::any>_> *phVar1;
  
  phVar1 = cs::
           allocator_type<cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>,64ul,cs_impl::default_allocator_provider>
           ::alloc<std::pair<cs_impl::any,cs_impl::any>&>
                     ((allocator_type<cs_impl::any::holder<std::pair<cs_impl::any,cs_impl::any>>,64ul,cs_impl::default_allocator_provider>
                       *)holder<std::pair<cs_impl::any,cs_impl::any>>::allocator,&this->mDat);
  return &phVar1->super_baseHolder;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}